

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

Driver * __thiscall hdc::Driver::getEnvPath(Driver *this,string *key)

{
  char *__name;
  allocator local_2a;
  undefined1 local_29;
  char *local_28;
  char *val;
  string *key_local;
  Driver *this_local;
  string *retval;
  
  key_local = key;
  this_local = this;
  __name = (char *)std::__cxx11::string::c_str();
  local_28 = getenv(__name);
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  if (local_28 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)this,local_28);
  }
  return this;
}

Assistant:

std::string Driver::getEnvPath(std::string key) {
    char * val;
    val = std::getenv( key.c_str() );
    std::string retval = "";

    if (val != NULL) {
        retval = val;
    }

    return retval;
}